

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.cpp
# Opt level: O0

void __thiscall
fp::Algorithm::FindNeighbours(Algorithm *this,array<int,_2UL> cur_node,char curr_dir)

{
  value_type_conflict vVar1;
  value_type_conflict vVar2;
  value_type_conflict vVar3;
  value_type_conflict vVar4;
  array<int,_2UL> cur_node_00;
  array<int,_2UL> cur_node_01;
  array<int,_2UL> cur_node_02;
  array<int,_2UL> cur_node_03;
  bool bVar5;
  element_type *peVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  array<int,_2UL> local_40;
  array<int,_2UL> node_E;
  array<int,_2UL> node_S;
  array<int,_2UL> node_W;
  array<int,_2UL> node_N;
  bool W;
  bool E;
  bool S;
  bool N;
  char robotDirection;
  char curr_dir_local;
  Algorithm *this_local;
  array<int,_2UL> cur_node_local;
  
  this_local = (Algorithm *)cur_node._M_elems;
  peVar6 = std::__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fp::LandBasedRobot,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->robot_);
  (**peVar6->_vptr_LandBasedRobot)();
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
  pvVar8 = std::array<std::array<bool,_16UL>,_16UL>::operator[]
                     (&(this->maze_info).North_,(long)*pvVar7);
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
  pvVar9 = std::array<bool,_16UL>::operator[](pvVar8,(long)*pvVar7);
  vVar1 = *pvVar9;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
  pvVar8 = std::array<std::array<bool,_16UL>,_16UL>::operator[]
                     (&(this->maze_info).South_,(long)*pvVar7);
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
  pvVar9 = std::array<bool,_16UL>::operator[](pvVar8,(long)*pvVar7);
  vVar2 = *pvVar9;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
  pvVar8 = std::array<std::array<bool,_16UL>,_16UL>::operator[]
                     (&(this->maze_info).East_,(long)*pvVar7);
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
  pvVar9 = std::array<bool,_16UL>::operator[](pvVar8,(long)*pvVar7);
  vVar3 = *pvVar9;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
  pvVar8 = std::array<std::array<bool,_16UL>,_16UL>::operator[]
                     (&(this->maze_info).West_,(long)*pvVar7);
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
  pvVar9 = std::array<bool,_16UL>::operator[](pvVar8,(long)*pvVar7);
  vVar4 = *pvVar9;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
  node_W._M_elems[0] = *pvVar7 + -1;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
  node_W._M_elems[1] = *pvVar7;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
  node_S._M_elems[0] = *pvVar7;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
  node_S._M_elems[1] = *pvVar7 + -1;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
  node_E._M_elems[0] = *pvVar7 + 1;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
  node_E._M_elems[1] = *pvVar7;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
  local_40._M_elems[0] = *pvVar7;
  pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
  local_40._M_elems[1] = *pvVar7 + 1;
  bVar5 = IsVisited(this,(array<int,_2UL>)this_local);
  if (!bVar5) {
    pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
    pvVar8 = std::array<std::array<bool,_16UL>,_16UL>::operator[]
                       (&this->visited_node_,(long)*pvVar7);
    pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
    pvVar9 = std::array<bool,_16UL>::operator[](pvVar8,(long)*pvVar7);
    *pvVar9 = true;
    this->visited_Count = this->visited_Count + 1;
    if (((((this->temp_goal_ & 1U) == 0) &&
         (pvVar7 = std::array<int,_2UL>::operator[](&local_40,1), *pvVar7 < 0x10)) &&
        ((vVar3 & 1U) == 0)) && (curr_dir != 'W')) {
      pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
      pvVar10 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                          (&this->node_master_,(long)*pvVar7);
      pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
      pvVar11 = std::array<fp::Node,_16UL>::operator[](pvVar10,(long)*pvVar7);
      std::
      stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
      ::push(&pvVar11->child_node_,&local_40);
      cur_node_00._M_elems[1] = local_40._M_elems[1];
      cur_node_00._M_elems[0] = local_40._M_elems[0];
      bVar5 = IsVisited(this,cur_node_00);
      if (!bVar5) {
        pvVar7 = std::array<int,_2UL>::operator[](&local_40,0);
        pvVar10 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                            (&this->node_master_,(long)*pvVar7);
        pvVar7 = std::array<int,_2UL>::operator[](&local_40,1);
        pvVar11 = std::array<fp::Node,_16UL>::operator[](pvVar10,(long)*pvVar7);
        *(Algorithm **)(pvVar11->parent_node_)._M_elems = this_local;
      }
    }
    if ((((this->temp_goal_ & 1U) == 0) &&
        (pvVar7 = std::array<int,_2UL>::operator[](&node_W,0), -1 < *pvVar7)) &&
       (((vVar1 & 1U) == 0 && (curr_dir != 'S')))) {
      pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
      pvVar10 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                          (&this->node_master_,(long)*pvVar7);
      pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
      pvVar11 = std::array<fp::Node,_16UL>::operator[](pvVar10,(long)*pvVar7);
      std::
      stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
      ::push(&pvVar11->child_node_,&node_W);
      cur_node_03._M_elems[1] = node_W._M_elems[1];
      cur_node_03._M_elems[0] = node_W._M_elems[0];
      bVar5 = IsVisited(this,cur_node_03);
      if (!bVar5) {
        pvVar7 = std::array<int,_2UL>::operator[](&node_W,0);
        pvVar10 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                            (&this->node_master_,(long)*pvVar7);
        pvVar7 = std::array<int,_2UL>::operator[](&node_W,1);
        pvVar11 = std::array<fp::Node,_16UL>::operator[](pvVar10,(long)*pvVar7);
        *(Algorithm **)(pvVar11->parent_node_)._M_elems = this_local;
      }
    }
    if ((((this->temp_goal_ & 1U) == 0) &&
        (pvVar7 = std::array<int,_2UL>::operator[](&node_S,1), -1 < *pvVar7)) &&
       (((vVar4 & 1U) == 0 && (curr_dir != 'E')))) {
      pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
      pvVar10 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                          (&this->node_master_,(long)*pvVar7);
      pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
      pvVar11 = std::array<fp::Node,_16UL>::operator[](pvVar10,(long)*pvVar7);
      std::
      stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
      ::push(&pvVar11->child_node_,&node_S);
      cur_node_02._M_elems[1] = node_S._M_elems[1];
      cur_node_02._M_elems[0] = node_S._M_elems[0];
      bVar5 = IsVisited(this,cur_node_02);
      if (!bVar5) {
        pvVar7 = std::array<int,_2UL>::operator[](&node_S,0);
        pvVar10 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                            (&this->node_master_,(long)*pvVar7);
        pvVar7 = std::array<int,_2UL>::operator[](&node_S,1);
        pvVar11 = std::array<fp::Node,_16UL>::operator[](pvVar10,(long)*pvVar7);
        *(Algorithm **)(pvVar11->parent_node_)._M_elems = this_local;
      }
    }
    if (((((this->temp_goal_ & 1U) == 0) &&
         (pvVar7 = std::array<int,_2UL>::operator[](&node_E,0), *pvVar7 < 0x10)) &&
        ((vVar2 & 1U) == 0)) && (curr_dir != 'N')) {
      pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,0);
      pvVar10 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                          (&this->node_master_,(long)*pvVar7);
      pvVar7 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&this_local,1);
      pvVar11 = std::array<fp::Node,_16UL>::operator[](pvVar10,(long)*pvVar7);
      std::
      stack<std::array<int,_2UL>,_std::deque<std::array<int,_2UL>,_std::allocator<std::array<int,_2UL>_>_>_>
      ::push(&pvVar11->child_node_,&node_E);
      cur_node_01._M_elems[1] = node_E._M_elems[1];
      cur_node_01._M_elems[0] = node_E._M_elems[0];
      bVar5 = IsVisited(this,cur_node_01);
      if (!bVar5) {
        pvVar7 = std::array<int,_2UL>::operator[](&node_E,0);
        pvVar10 = std::array<std::array<fp::Node,_16UL>,_16UL>::operator[]
                            (&this->node_master_,(long)*pvVar7);
        pvVar7 = std::array<int,_2UL>::operator[](&node_E,1);
        pvVar11 = std::array<fp::Node,_16UL>::operator[](pvVar10,(long)*pvVar7);
        *(Algorithm **)(pvVar11->parent_node_)._M_elems = this_local;
      }
    }
  }
  return;
}

Assistant:

void fp::Algorithm::FindNeighbours(std::array<int, 2> cur_node, char curr_dir) {
    char robotDirection{this->robot_->GetDirection()};
    bool N{this->maze_info.North_[cur_node[0]][cur_node[1]]},
            S{this->maze_info.South_[cur_node[0]][cur_node[1]]},
            E{this->maze_info.East_[cur_node[0]][cur_node[1]]},
            W{this->maze_info.West_[cur_node[0]][cur_node[1]]};

    //---> Compute the neighbouring possible  nodes <---//
    std::array<int, 2> node_N{cur_node[0] - 1, cur_node[1]},
            node_W{cur_node[0], cur_node[1] - 1},
            node_S{cur_node[0] + 1, cur_node[1]},
            node_E{cur_node[0], cur_node[1] + 1};

    if (!IsVisited(cur_node)) {
        this->visited_node_[cur_node[0]][cur_node[1]] = true;
        this->visited_Count++;
        if (!this->temp_goal_ && node_E[1] <= 15 && !E && curr_dir != 'W') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_E);
            if (!IsVisited(node_E))
                this->node_master_[node_E[0]][node_E[1]].parent_node_ = cur_node;
        }
        if (!this->temp_goal_ && node_N[0] >= 0 && !N && curr_dir != 'S') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_N);
            if (!IsVisited(node_N))
                this->node_master_[node_N[0]][node_N[1]].parent_node_ = cur_node;
        }
        if (!this->temp_goal_ && node_W[1] >= 0 && !W && curr_dir != 'E') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_W);
            if (!IsVisited(node_W))
                this->node_master_[node_W[0]][node_W[1]].parent_node_ = cur_node;
        }
        if (!this->temp_goal_ && node_S[0] <= 15 && !S && curr_dir != 'N') {
            this->node_master_[cur_node[0]][cur_node[1]].child_node_.push(node_S);
            if (!IsVisited(node_S))
                this->node_master_[node_S[0]][node_S[1]].parent_node_ = cur_node;
        }
    }
}